

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::checkForNamedInterface(CoreBroker *this,ActionMessage *command)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  uint16_t flags;
  GlobalHandle target;
  GlobalHandle target_00;
  GlobalHandle target_01;
  GlobalHandle fed_id;
  GlobalHandle GVar22;
  GlobalHandle target_02;
  GlobalHandle fed_id_00;
  GlobalHandle target_03;
  GlobalHandle target_04;
  GlobalHandle fed_id_01;
  GlobalHandle target_05;
  GlobalHandle fed_id_02;
  size_type sVar23;
  byte *pbVar24;
  undefined1 auVar25 [16];
  string_view type;
  string_view message;
  string_view units;
  ushort uVar26;
  BasicHandleInfo *pBVar27;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var28;
  string *psVar29;
  BasicHandleInfo *pBVar30;
  InterfaceType what;
  InterfaceHandle IVar31;
  action_t newAction;
  GlobalFederateId fed_id_03;
  char *pcVar32;
  bool bVar33;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view name;
  string_view string1;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view string1_00;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view string1_01;
  string_view string1_02;
  string_view string2;
  string_view string2_00;
  string_view name_03;
  string_view string2_01;
  string_view string2_02;
  string_view str;
  size_t sVar34;
  char *pcVar35;
  size_t sVar36;
  char *pcVar37;
  GlobalFederateId local_84;
  undefined8 local_80;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char *pcStack_38;
  
  flags = command->flags;
  if (((char)flags < '\0') && ((this->super_BrokerBase).field_0x294 == '\x01')) {
    switch(command->messageAction) {
    case cmd_add_named_input:
      target.fed_id.gid = (command->source_id).gid;
      target.handle.hid = (command->source_handle).hid;
      key._M_str = (char *)(command->payload).heap;
      key._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addReconnectableInput(&this->unknownHandles,key,target,flags);
      break;
    case cmd_add_named_filter:
      target_01.fed_id.gid = (command->source_id).gid;
      target_01.handle.hid = (command->source_handle).hid;
      key_02._M_str = (char *)(command->payload).heap;
      key_02._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addReconnectableFilter(&this->unknownHandles,key_02,target_01,flags);
      break;
    case cmd_add_named_publication:
      target_00.fed_id.gid = (command->source_id).gid;
      target_00.handle.hid = (command->source_handle).hid;
      key_00._M_str = (char *)(command->payload).heap;
      key_00._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addReconnectablePublication
                (&this->unknownHandles,key_00,target_00,flags);
      break;
    case cmd_add_named_endpoint:
      GVar22.fed_id.gid = (command->source_id).gid;
      GVar22.handle.hid = (command->source_handle).hid;
      key_01._M_str = (char *)(command->payload).heap;
      key_01._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addReconnectableEndpoint(&this->unknownHandles,key_01,GVar22,flags);
    }
  }
  switch(command->messageAction) {
  case cmd_add_named_input:
    name._M_str = (char *)(command->payload).heap;
    name._M_len = (command->payload).bufferSize;
    pBVar27 = HandleManager::getInterfaceHandle(&this->handles,name,INPUT);
    bVar33 = pBVar27 != (BasicHandleInfo *)0x0;
    if (bVar33) {
      local_84.gid = (pBVar27->handle).fed_id.gid;
      _Var28 = gmlc::containers::
               DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
               ::find(&this->mFederates,&local_84);
      if ((_Var28._M_current)->state < ERROR_STATE) {
        ActionMessage::setAction(command,cmd_add_publisher);
        IVar31.hid = (pBVar27->handle).handle.hid;
        command->dest_id = (GlobalFederateId)(pBVar27->handle).fed_id.gid;
        command->dest_handle = (InterfaceHandle)IVar31.hid;
        fed_id.fed_id.gid = (command->source_id).gid;
        fed_id.handle.hid = (command->source_handle).hid;
        pBVar30 = HandleManager::findHandle(&this->handles,fed_id);
        if (pBVar30 != (BasicHandleInfo *)0x0) {
          string1._M_str = (pBVar30->type)._M_dataplus._M_p;
          string1._M_len = (pBVar30->type)._M_string_length;
          string2._M_str = (pBVar30->units)._M_dataplus._M_p;
          string2._M_len = (pBVar30->units)._M_string_length;
          ActionMessage::setStringData(command,string1,string2);
        }
        (command->payload).bufferSize = 0;
        routeMessage(this,command);
        ActionMessage::setAction(command,cmd_add_subscriber);
        uVar2 = command->source_id;
        uVar7 = command->source_handle;
        uVar12 = command->dest_id;
        uVar17 = command->dest_handle;
        command->source_id = (GlobalFederateId)uVar12;
        command->source_handle = (InterfaceHandle)uVar17;
        command->dest_id = (GlobalFederateId)uVar2;
        command->dest_handle = (InterfaceHandle)uVar7;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&command->stringData,
                          (command->stringData).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        pbVar24 = (byte *)(pBVar27->key)._M_dataplus._M_p;
        sVar36 = (pBVar27->key)._M_string_length;
        if ((command->payload).heap == pbVar24) {
          (command->payload).bufferSize = sVar36;
        }
        else {
          SmallBuffer::reserve(&command->payload,sVar36);
          (command->payload).bufferSize = sVar36;
          if (sVar36 != 0) {
            memcpy((command->payload).heap,pbVar24,sVar36);
          }
        }
        goto LAB_002f6f19;
      }
      newAction = cmd_add_subscriber;
LAB_002f6c37:
      ActionMessage::setAction(command,newAction);
      *(byte *)&command->flags = (byte)command->flags | 0x10;
      uVar5 = command->source_id;
      uVar10 = command->source_handle;
      uVar15 = command->dest_id;
      uVar20 = command->dest_handle;
      command->source_id = (GlobalFederateId)uVar15;
      command->source_handle = (InterfaceHandle)uVar20;
      command->dest_id = (GlobalFederateId)uVar5;
      command->dest_handle = (InterfaceHandle)uVar10;
      IVar31.hid = (pBVar27->handle).handle.hid;
      command->source_id = (GlobalFederateId)(pBVar27->handle).fed_id.gid;
      command->source_handle = (InterfaceHandle)IVar31.hid;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&command->stringData,
                        (command->stringData).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
LAB_002f6f19:
      routeMessage(this,command);
      return;
    }
    break;
  case cmd_add_named_filter:
    name_02._M_str = (char *)(command->payload).heap;
    name_02._M_len = (command->payload).bufferSize;
    pBVar27 = HandleManager::getInterfaceHandle(&this->handles,name_02,FILTER);
    bVar33 = pBVar27 != (BasicHandleInfo *)0x0;
    if (bVar33) {
      ActionMessage::setAction(command,cmd_add_endpoint);
      GVar22 = pBVar27->handle;
      (command->dest_id).gid = GVar22.fed_id.gid.gid;
      (command->dest_handle).hid = GVar22.handle.hid.hid;
      (command->payload).bufferSize = 0;
      routeMessage(this,command);
      ActionMessage::setAction(command,cmd_add_filter);
      uVar4 = command->source_id;
      uVar9 = command->source_handle;
      uVar14 = command->dest_id;
      uVar19 = command->dest_handle;
      command->source_id = (GlobalFederateId)uVar14;
      command->source_handle = (InterfaceHandle)uVar19;
      command->dest_id = (GlobalFederateId)uVar4;
      command->dest_handle = (InterfaceHandle)uVar9;
      sVar23 = pBVar27->type_in->_M_string_length;
      if ((sVar23 != 0) || (pBVar27->type_out->_M_string_length != 0)) {
        string1_00._M_str = (pBVar27->type_in->_M_dataplus)._M_p;
        string1_00._M_len = sVar23;
        string2_00._M_str = (pBVar27->type_out->_M_dataplus)._M_p;
        string2_00._M_len = pBVar27->type_out->_M_string_length;
        ActionMessage::setStringData(command,string1_00,string2_00);
      }
      if ((pBVar27->flags & 0x200) != 0) {
        pbVar1 = (byte *)((long)&command->flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      goto LAB_002f6c02;
    }
    break;
  case cmd_add_named_publication:
    name_00._M_str = (char *)(command->payload).heap;
    name_00._M_len = (command->payload).bufferSize;
    pBVar27 = HandleManager::getInterfaceHandle(&this->handles,name_00,PUBLICATION);
    bVar33 = pBVar27 != (BasicHandleInfo *)0x0;
    if (bVar33) {
      local_84.gid = (pBVar27->handle).fed_id.gid;
      _Var28 = gmlc::containers::
               DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
               ::find(&this->mFederates,&local_84);
      if ((_Var28._M_current)->state < ERROR_STATE) {
        ActionMessage::setAction(command,cmd_add_subscriber);
        GVar22 = pBVar27->handle;
        (command->dest_id).gid = GVar22.fed_id.gid.gid;
        (command->dest_handle).hid = GVar22.handle.hid.hid;
        (command->payload).bufferSize = 0;
        routeMessage(this,command);
        ActionMessage::setAction(command,cmd_add_publisher);
        uVar3 = command->source_id;
        uVar8 = command->source_handle;
        uVar13 = command->dest_id;
        uVar18 = command->dest_handle;
        command->source_id = (GlobalFederateId)uVar13;
        command->source_handle = (InterfaceHandle)uVar18;
        command->dest_id = (GlobalFederateId)uVar3;
        command->dest_handle = (InterfaceHandle)uVar8;
        pbVar24 = (byte *)(pBVar27->key)._M_dataplus._M_p;
        sVar36 = (pBVar27->key)._M_string_length;
        if ((command->payload).heap == pbVar24) {
          (command->payload).bufferSize = sVar36;
        }
        else {
          SmallBuffer::reserve(&command->payload,sVar36);
          (command->payload).bufferSize = sVar36;
          if (sVar36 != 0) {
            memcpy((command->payload).heap,pbVar24,sVar36);
          }
        }
        string1_02._M_str = (pBVar27->type)._M_dataplus._M_p;
        string1_02._M_len = (pBVar27->type)._M_string_length;
        string2_02._M_str = (pBVar27->units)._M_dataplus._M_p;
        string2_02._M_len = (pBVar27->units)._M_string_length;
        ActionMessage::setStringData(command,string1_02,string2_02);
        goto LAB_002f6f19;
      }
      newAction = cmd_add_publisher;
      goto LAB_002f6c37;
    }
    break;
  case cmd_add_named_endpoint:
    name_01._M_str = (char *)(command->payload).heap;
    name_01._M_len = (command->payload).bufferSize;
    pBVar27 = HandleManager::getInterfaceHandle(&this->handles,name_01,ENDPOINT);
    bVar33 = pBVar27 != (BasicHandleInfo *)0x0;
    if (bVar33) {
      local_84.gid = (pBVar27->handle).fed_id.gid;
      _Var28 = gmlc::containers::
               DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
               ::find(&this->mFederates,&local_84);
      if (0x27 < (_Var28._M_current)->state) {
        newAction = cmd_add_endpoint;
        goto LAB_002f6c37;
      }
      if (command->counter == 0x65) {
        ActionMessage::setAction(command,cmd_add_endpoint);
        uVar26 = command->flags ^ 2;
LAB_002f6e58:
        command->flags = uVar26;
      }
      else {
        ActionMessage::setAction(command,cmd_add_filter);
        fed_id_02.fed_id.gid = (command->source_id).gid;
        fed_id_02.handle.hid = (command->source_handle).hid;
        pBVar30 = HandleManager::findHandle(&this->handles,fed_id_02);
        if (pBVar30 != (BasicHandleInfo *)0x0) {
          sVar23 = pBVar30->type_in->_M_string_length;
          if ((sVar23 != 0) || (pBVar30->type_out->_M_string_length != 0)) {
            string1_01._M_str = (pBVar30->type_in->_M_dataplus)._M_p;
            string1_01._M_len = sVar23;
            string2_01._M_str = (pBVar30->type_out->_M_dataplus)._M_p;
            string2_01._M_len = pBVar30->type_out->_M_string_length;
            ActionMessage::setStringData(command,string1_01,string2_01);
          }
          if ((pBVar30->flags & 0x200) != 0) {
            uVar26 = command->flags | 0x200;
            goto LAB_002f6e58;
          }
        }
      }
      IVar31.hid = (pBVar27->handle).handle.hid;
      command->dest_id = (GlobalFederateId)(pBVar27->handle).fed_id.gid;
      command->dest_handle = (InterfaceHandle)IVar31.hid;
      routeMessage(this,command);
      ActionMessage::setAction(command,cmd_add_endpoint);
      if (command->counter == 0x65) {
        *(byte *)&command->flags = (byte)command->flags ^ 2;
        pbVar24 = (byte *)(pBVar27->key)._M_dataplus._M_p;
        sVar36 = (pBVar27->key)._M_string_length;
        if ((command->payload).heap == pbVar24) {
          (command->payload).bufferSize = sVar36;
        }
        else {
          SmallBuffer::reserve(&command->payload,sVar36);
          (command->payload).bufferSize = sVar36;
          if (sVar36 != 0) {
            memcpy((command->payload).heap,pbVar24,sVar36);
          }
        }
        str._M_str = (pBVar27->type)._M_dataplus._M_p;
        str._M_len = (pBVar27->type)._M_string_length;
        ActionMessage::setString(command,0,str);
      }
      uVar6 = command->source_id;
      uVar11 = command->source_handle;
      uVar16 = command->dest_id;
      uVar21 = command->dest_handle;
      command->source_id = (GlobalFederateId)uVar16;
      command->source_handle = (InterfaceHandle)uVar21;
      command->dest_id = (GlobalFederateId)uVar6;
      command->dest_handle = (InterfaceHandle)uVar11;
      goto LAB_002f6f19;
    }
    break;
  default:
    goto switchD_002f67e0_default;
  }
  if (!bVar33) {
switchD_002f67e0_default:
    if ((this->super_BrokerBase).field_0x294 != '\x01') {
LAB_002f6c02:
      routeMessage(this,command);
      return;
    }
    switch(command->messageAction) {
    case cmd_add_named_input:
      target_02.fed_id.gid = (command->source_id).gid;
      target_02.handle.hid = (command->source_handle).hid;
      key_03._M_str = (char *)(command->payload).heap;
      key_03._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addUnknownInput(&this->unknownHandles,key_03,target_02,command->flags);
      if (((command->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (command->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (fed_id_00.fed_id.gid = (command->source_id).gid,
         fed_id_00.handle.hid = (command->source_handle).hid,
         pBVar27 = HandleManager::findHandle(&this->handles,fed_id_00),
         pBVar27 == (BasicHandleInfo *)0x0)) {
        fed_id_03.gid = (command->source_id).gid;
        IVar31.hid = (command->source_handle).hid;
        psVar29 = ActionMessage::getString_abi_cxx11_(command,0);
        pcStack_38 = (psVar29->_M_dataplus)._M_p;
        local_40 = psVar29->_M_string_length;
        psVar29 = ActionMessage::getString_abi_cxx11_(command,1);
        pcVar37 = (psVar29->_M_dataplus)._M_p;
        sVar36 = psVar29->_M_string_length;
        what = PUBLICATION;
        pcVar32 = (char *)0x0;
        sVar34 = local_40;
        pcVar35 = pcStack_38;
        local_50 = sVar36;
        pcStack_48 = pcVar37;
LAB_002f6d5f:
        type._M_str = pcVar35;
        type._M_len = sVar34;
        units._M_str = pcVar37;
        units._M_len = sVar36;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = pcVar32;
        pBVar27 = HandleManager::addHandle
                            (&this->handles,fed_id_03,IVar31,what,(string_view)(auVar25 << 0x40),
                             type,units);
        addLocalInfo(this,pBVar27,command);
        return;
      }
      break;
    case cmd_add_named_filter:
      target_05.fed_id.gid = (command->source_id).gid;
      target_05.handle.hid = (command->source_handle).hid;
      key_06._M_str = (char *)(command->payload).heap;
      key_06._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addUnknownFilter(&this->unknownHandles,key_06,target_05,command->flags);
      return;
    case cmd_add_named_publication:
      target_03.fed_id.gid = (command->source_id).gid;
      target_03.handle.hid = (command->source_handle).hid;
      key_04._M_str = (char *)(command->payload).heap;
      key_04._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addUnknownPublication
                (&this->unknownHandles,key_04,target_03,command->flags);
      return;
    case cmd_add_named_endpoint:
      target_04.fed_id.gid = (command->source_id).gid;
      target_04.handle.hid = (command->source_handle).hid;
      key_05._M_str = (char *)(command->payload).heap;
      key_05._M_len = (command->payload).bufferSize;
      UnknownHandleManager::addUnknownEndpoint
                (&this->unknownHandles,key_05,target_04,command->flags);
      if (((command->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (command->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (fed_id_01.fed_id.gid = (command->source_id).gid,
         fed_id_01.handle.hid = (command->source_handle).hid,
         pBVar27 = HandleManager::findHandle(&this->handles,fed_id_01),
         pBVar27 == (BasicHandleInfo *)0x0)) {
        fed_id_03.gid = (command->source_id).gid;
        IVar31.hid = (command->source_handle).hid;
        psVar29 = ActionMessage::getString_abi_cxx11_(command,0);
        pcStack_58 = (psVar29->_M_dataplus)._M_p;
        local_60 = psVar29->_M_string_length;
        psVar29 = ActionMessage::getString_abi_cxx11_(command,1);
        pcVar37 = (psVar29->_M_dataplus)._M_p;
        sVar36 = psVar29->_M_string_length;
        pcVar32 = "";
        what = FILTER;
        sVar34 = local_60;
        pcVar35 = pcStack_58;
        local_70 = sVar36;
        pcStack_68 = pcVar37;
        goto LAB_002f6d5f;
      }
      break;
    default:
      local_80 = 0x33;
      pcStack_78 = "unknown command in interface addition code section\n";
      message._M_str = "unknown command in interface addition code section\n";
      message._M_len = 0x33;
      name_03._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_03._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (&this->super_BrokerBase,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name_03,
                 message,false);
    }
  }
  return;
}

Assistant:

void CoreBroker::checkForNamedInterface(ActionMessage& command)
{
    bool foundInterface = false;
    if (checkActionFlag(command, reconnectable_flag)) {
        if (isRootc) {
            switch (command.action()) {
                case CMD_ADD_NAMED_PUBLICATION:
                    unknownHandles.addReconnectablePublication(command.name(),
                                                               command.getSource(),
                                                               command.flags);
                    break;
                case CMD_ADD_NAMED_INPUT:
                    unknownHandles.addReconnectableInput(command.name(),
                                                         command.getSource(),
                                                         command.flags);

                    break;
                case CMD_ADD_NAMED_ENDPOINT:
                    unknownHandles.addReconnectableEndpoint(command.name(),
                                                            command.getSource(),
                                                            command.flags);

                    break;
                case CMD_ADD_NAMED_FILTER:
                    unknownHandles.addReconnectableFilter(command.name(),
                                                          command.getSource(),
                                                          command.flags);
                    break;
                default:
                    break;
            }
        }
    }
    switch (command.action()) {
        case CMD_ADD_NAMED_PUBLICATION: {
            auto* pub = handles.getInterfaceHandle(command.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                auto fed = mFederates.find(pub->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    command.setDestination(pub->handle);
                    command.payload.clear();
                    routeMessage(command);
                    command.setAction(CMD_ADD_PUBLISHER);
                    command.swapSourceDest();
                    command.name(pub->key);
                    command.setStringData(pub->type, pub->units);
                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_PUBLISHER);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(pub->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_INPUT: {
            auto* inp = handles.getInterfaceHandle(command.name(), InterfaceType::INPUT);
            if (inp != nullptr) {
                auto fed = mFederates.find(inp->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    command.setAction(CMD_ADD_PUBLISHER);
                    command.setDestination(inp->handle);
                    auto* pub = handles.findHandle(command.getSource());
                    if (pub != nullptr) {
                        command.setStringData(pub->type, pub->units);
                    }
                    command.payload.clear();
                    routeMessage(command);
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    command.swapSourceDest();
                    command.clearStringData();
                    command.name(inp->key);
                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_SUBSCRIBER);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(inp->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_FILTER: {
            auto* filt = handles.getInterfaceHandle(command.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                command.setAction(CMD_ADD_ENDPOINT);
                command.setDestination(filt->handle);
                command.payload.clear();
                routeMessage(command);
                command.setAction(CMD_ADD_FILTER);
                command.swapSourceDest();
                if ((!filt->type_in.empty()) || (!filt->type_out.empty())) {
                    command.setStringData(filt->type_in, filt->type_out);
                }
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(command, clone_flag);
                }
                routeMessage(command);
                foundInterface = true;
            }
        } break;
        case CMD_ADD_NAMED_ENDPOINT: {
            auto* ept = handles.getInterfaceHandle(command.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                auto fed = mFederates.find(ept->getFederateId());
                if (fed->state < ConnectionState::ERROR_STATE) {
                    if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                        command.setAction(CMD_ADD_ENDPOINT);
                        toggleActionFlag(command, destination_target);
                    } else {
                        command.setAction(CMD_ADD_FILTER);
                        auto* filt = handles.findHandle(command.getSource());
                        if (filt != nullptr) {
                            if ((!filt->type_in.empty()) || (!filt->type_out.empty())) {
                                command.setStringData(filt->type_in, filt->type_out);
                            }
                            if (checkActionFlag(*filt, clone_flag)) {
                                setActionFlag(command, clone_flag);
                            }
                        }
                    }
                    command.setDestination(ept->handle);
                    routeMessage(command);
                    command.setAction(CMD_ADD_ENDPOINT);
                    if (command.counter == static_cast<uint16_t>(InterfaceType::ENDPOINT)) {
                        toggleActionFlag(command, destination_target);
                        command.name(ept->key);
                        command.setString(typeStringLoc, ept->type);
                    }
                    command.swapSourceDest();
                    // command.setSource(ept->handle);

                    routeMessage(command);
                } else {
                    command.setAction(CMD_ADD_ENDPOINT);
                    setActionFlag(command, error_flag);
                    command.swapSourceDest();
                    command.setSource(ept->handle);
                    command.clearStringData();
                    routeMessage(command);
                }
                foundInterface = true;
            }
        } break;
        default:
            break;
    }

    if (!foundInterface) {
        if (isRootc) {
            switch (command.action()) {
                case CMD_ADD_NAMED_PUBLICATION:
                    unknownHandles.addUnknownPublication(command.name(),
                                                         command.getSource(),
                                                         command.flags);
                    break;
                case CMD_ADD_NAMED_INPUT:
                    unknownHandles.addUnknownInput(command.name(),
                                                   command.getSource(),
                                                   command.flags);
                    if (!command.getStringData().empty()) {
                        auto* pub = handles.findHandle(command.getSource());
                        if (pub == nullptr) {
                            // an anonymous publisher is adding an input
                            auto& apub = handles.addHandle(command.source_id,
                                                           command.source_handle,
                                                           InterfaceType::PUBLICATION,
                                                           std::string_view(),
                                                           command.getString(typeStringLoc),
                                                           command.getString(unitStringLoc));

                            addLocalInfo(apub, command);
                        }
                    }
                    break;
                case CMD_ADD_NAMED_ENDPOINT:
                    unknownHandles.addUnknownEndpoint(command.name(),
                                                      command.getSource(),
                                                      command.flags);
                    if (!command.getStringData().empty()) {
                        auto* filt = handles.findHandle(command.getSource());
                        if (filt == nullptr) {
                            // an anonymous filter is adding an endpoint
                            auto& afilt = handles.addHandle(command.source_id,
                                                            command.source_handle,
                                                            InterfaceType::FILTER,
                                                            "",
                                                            command.getString(typeStringLoc),
                                                            command.getString(typeOutStringLoc));

                            addLocalInfo(afilt, command);
                        }
                    }
                    break;
                case CMD_ADD_NAMED_FILTER:
                    unknownHandles.addUnknownFilter(command.name(),
                                                    command.getSource(),
                                                    command.flags);
                    break;
                default:
                    LOG_WARNING(global_broker_id_local,
                                getIdentifier(),
                                "unknown command in interface addition code section\n");
                    break;
            }
        } else {
            routeMessage(command);
        }
    }
}